

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZFNMatrix<9,_double>,_18>::~TPZManVector
          (TPZManVector<TPZFNMatrix<9,_double>,_18> *this)

{
  ~TPZManVector(this);
  operator_delete(this,0xfe0);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}